

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O1

bool crnlib::file_utils::get_extension(dynamic_string *filename)

{
  int iVar1;
  int iVar2;
  
  iVar1 = dynamic_string::find_right(filename,'/');
  iVar2 = dynamic_string::find_right(filename,'.');
  if (iVar2 < iVar1) {
    dynamic_string::clear(filename);
  }
  else {
    dynamic_string::right(filename,iVar2 + 1);
  }
  return iVar1 <= iVar2;
}

Assistant:

bool file_utils::get_extension(dynamic_string& filename) {
  int sep = -1;
#ifdef WIN32
  sep = filename.find_right('\\');
#endif
  if (sep < 0)
    sep = filename.find_right('/');

  int dot = filename.find_right('.');
  if (dot < sep) {
    filename.clear();
    return false;
  }

  filename.right(dot + 1);

  return true;
}